

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree_FastGen.hpp
# Opt level: O0

void __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::GenMatcher::Substitution::
~Substitution(Substitution *this)

{
  Substitution *in_RDI;
  size_t in_stack_ffffffffffffffe8;
  
  ~Substitution(in_RDI);
  operator_delete(in_RDI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

~Substitution()
  {
    if(_applicator) {
      delete _applicator;
    }
  }